

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void wasm::PostWalker<Sinker,_wasm::Visitor<Sinker,_void>_>::scan(Sinker *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  Resume *pRVar2;
  StackSwitch *pSVar3;
  Expression **ppEVar4;
  AtomicWait *pAVar5;
  ContBind *pCVar6;
  TryTable *pTVar7;
  GlobalSet *pGVar8;
  CallRef *pCVar9;
  StructGet *pSVar10;
  Call *pCVar11;
  AtomicCmpxchg *pAVar12;
  CallIndirect *pCVar13;
  Load *pLVar14;
  Try *pTVar15;
  Break *pBVar16;
  Switch *pSVar17;
  ArrayNew *pAVar18;
  Return *pRVar19;
  StructNew *pSVar20;
  SIMDLoad *pSVar21;
  Suspend *pSVar22;
  Store *pSVar23;
  Throw *pTVar24;
  MemoryCopy *pMVar25;
  ResumeThrow *pRVar26;
  TupleMake *pTVar27;
  ArrayNewFixed *pAVar28;
  ulong uVar29;
  
  this = *currp;
  switch(this->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                       ,0x103);
  case BlockId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitBlock,currp);
    pBVar1 = Expression::cast<wasm::Block>(this);
    uVar29 = (ulong)(uint)(pBVar1->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pBVar1->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
                ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case IfId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitIf,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::If>(this);
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::maybePushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,&pMVar25->size);
    goto LAB_00b593f8;
  case LoopId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitLoop,currp);
    pGVar8 = (GlobalSet *)Expression::cast<wasm::Loop>(this);
    goto LAB_00b58fd1;
  case BreakId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitBreak,currp);
    pBVar16 = Expression::cast<wasm::Break>(this);
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::maybePushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,&pBVar16->condition);
    ppEVar4 = &pBVar16->value;
    goto LAB_00b58ecb;
  case SwitchId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitSwitch,currp);
    pSVar17 = Expression::cast<wasm::Switch>(this);
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,&pSVar17->condition);
    ppEVar4 = &pSVar17->value;
    goto LAB_00b58ecb;
  case CallId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitCall,currp);
    pCVar11 = Expression::cast<wasm::Call>(this);
    uVar29 = (ulong)(uint)(pCVar11->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar11->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
                ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case CallIndirectId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitCallIndirect,currp);
    pCVar13 = Expression::cast<wasm::CallIndirect>(this);
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,&pCVar13->target);
    uVar29 = (ulong)(uint)(pCVar13->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar13->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
                ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case LocalGetId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitLocalGet,currp);
    Expression::cast<wasm::LocalGet>(this);
    return;
  case LocalSetId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitLocalSet,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::LocalSet>(this);
    goto LAB_00b59229;
  case GlobalGetId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitGlobalGet,currp);
    Expression::cast<wasm::GlobalGet>(this);
    return;
  case GlobalSetId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitGlobalSet,currp);
    pGVar8 = Expression::cast<wasm::GlobalSet>(this);
    goto LAB_00b58fd1;
  case LoadId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitLoad,currp);
    pLVar14 = Expression::cast<wasm::Load>(this);
    ppEVar4 = &pLVar14->ptr;
    goto LAB_00b59410;
  case StoreId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitStore,currp);
    pSVar23 = Expression::cast<wasm::Store>(this);
    goto LAB_00b591f0;
  case ConstId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitConst,currp);
    Expression::cast<wasm::Const>(this);
    return;
  case UnaryId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitUnary,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::Unary>(this);
    goto LAB_00b59229;
  case BinaryId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitBinary,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::Binary>(this);
    goto LAB_00b59192;
  case SelectId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitSelect,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::Select>(this);
    goto LAB_00b593e9;
  case DropId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitDrop,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::Drop>(this);
    goto LAB_00b59062;
  case ReturnId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitReturn,currp);
    pRVar19 = Expression::cast<wasm::Return>(this);
    ppEVar4 = &pRVar19->value;
    goto LAB_00b58ecb;
  case MemorySizeId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitMemorySize,currp);
    Expression::cast<wasm::MemorySize>(this);
    return;
  case MemoryGrowId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitMemoryGrow,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::MemoryGrow>(this);
    goto LAB_00b59062;
  case NopId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitNop,currp);
    Expression::cast<wasm::Nop>(this);
    return;
  case UnreachableId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitUnreachable,currp);
    Expression::cast<wasm::Unreachable>(this);
    return;
  case AtomicRMWId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitAtomicRMW,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::AtomicRMW>(this);
    goto LAB_00b59270;
  case AtomicCmpxchgId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitAtomicCmpxchg,currp);
    pAVar12 = Expression::cast<wasm::AtomicCmpxchg>(this);
    goto LAB_00b59261;
  case AtomicWaitId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitAtomicWait,currp);
    pAVar5 = Expression::cast<wasm::AtomicWait>(this);
    goto LAB_00b58ff1;
  case AtomicNotifyId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitAtomicNotify,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::AtomicNotify>(this);
    goto LAB_00b59192;
  case AtomicFenceId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitAtomicFence,currp);
    Expression::cast<wasm::AtomicFence>(this);
    return;
  case SIMDExtractId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitSIMDExtract,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::SIMDExtract>(this);
    goto LAB_00b59229;
  case SIMDReplaceId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitSIMDReplace,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::SIMDReplace>(this);
    ppEVar4 = &pAVar5->timeout;
    goto LAB_00b591a0;
  case SIMDShuffleId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitSIMDShuffle,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::SIMDShuffle>(this);
    goto LAB_00b593f8;
  case SIMDTernaryId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitSIMDTernary,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::SIMDTernary>(this);
    goto LAB_00b58ff1;
  case SIMDShiftId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitSIMDShift,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::SIMDShift>(this);
    goto LAB_00b59192;
  case SIMDLoadId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitSIMDLoad,currp);
    pSVar21 = Expression::cast<wasm::SIMDLoad>(this);
    goto LAB_00b5912c;
  case SIMDLoadStoreLaneId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitSIMDLoadStoreLane,currp);
    pSVar23 = (Store *)Expression::cast<wasm::SIMDLoadStoreLane>(this);
LAB_00b591f0:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,&pSVar23->value);
    ppEVar4 = &pSVar23->ptr;
    goto LAB_00b59410;
  case MemoryInitId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitMemoryInit,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::MemoryInit>(this);
    goto LAB_00b59261;
  case DataDropId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitDataDrop,currp);
    Expression::cast<wasm::DataDrop>(this);
    return;
  case MemoryCopyId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitMemoryCopy,currp);
    pMVar25 = Expression::cast<wasm::MemoryCopy>(this);
    goto LAB_00b593e9;
  case MemoryFillId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitMemoryFill,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::MemoryFill>(this);
    goto LAB_00b593e9;
  case PopId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitPop,currp);
    Expression::cast<wasm::Pop>(this);
    return;
  case RefNullId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitRefNull,currp);
    Expression::cast<wasm::RefNull>(this);
    return;
  case RefIsNullId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitRefIsNull,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefIsNull>(this);
    goto LAB_00b59062;
  case RefFuncId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitRefFunc,currp);
    Expression::cast<wasm::RefFunc>(this);
    return;
  case RefEqId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitRefEq,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::RefEq>(this);
    goto LAB_00b593f8;
  case TableGetId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitTableGet,currp);
    pGVar8 = (GlobalSet *)Expression::cast<wasm::TableGet>(this);
LAB_00b58fd1:
    ppEVar4 = &pGVar8->value;
    goto LAB_00b59410;
  case TableSetId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitTableSet,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableSet>(this);
    goto LAB_00b59270;
  case TableSizeId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitTableSize,currp);
    Expression::cast<wasm::TableSize>(this);
    return;
  case TableGrowId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitTableGrow,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableGrow>(this);
    goto LAB_00b59270;
  case TableFillId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitTableFill,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableFill>(this);
    goto LAB_00b59261;
  case TableCopyId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitTableCopy,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::TableCopy>(this);
    goto LAB_00b593e9;
  case TableInitId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitTableInit,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableInit>(this);
    goto LAB_00b59261;
  case TryId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitTry,currp);
    pTVar15 = Expression::cast<wasm::Try>(this);
    uVar29 = (ulong)(uint)(pTVar15->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar15->catchBodies).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
                ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,ppEVar4);
    }
    ppEVar4 = &pTVar15->body;
    goto LAB_00b59410;
  case TryTableId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitTryTable,currp);
    pTVar7 = Expression::cast<wasm::TryTable>(this);
    goto LAB_00b59062;
  case ThrowId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitThrow,currp);
    pTVar24 = Expression::cast<wasm::Throw>(this);
    uVar29 = (ulong)(uint)(pTVar24->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar24->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
                ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case RethrowId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitRethrow,currp);
    Expression::cast<wasm::Rethrow>(this);
    return;
  case ThrowRefId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitThrowRef,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::ThrowRef>(this);
    goto LAB_00b59062;
  case TupleMakeId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitTupleMake,currp);
    pTVar27 = Expression::cast<wasm::TupleMake>(this);
    uVar29 = (ulong)(uint)(pTVar27->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar27->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
                ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case TupleExtractId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitTupleExtract,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::TupleExtract>(this);
    goto LAB_00b59062;
  case RefI31Id:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitRefI31,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefI31>(this);
    goto LAB_00b59062;
  case I31GetId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitI31Get,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::I31Get>(this);
    goto LAB_00b59062;
  case CallRefId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitCallRef,currp);
    pCVar9 = Expression::cast<wasm::CallRef>(this);
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,&pCVar9->target);
    uVar29 = (ulong)(uint)(pCVar9->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar9->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
                ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case RefTestId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitRefTest,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefTest>(this);
    goto LAB_00b59062;
  case RefCastId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitRefCast,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefCast>(this);
    goto LAB_00b59062;
  case BrOnId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitBrOn,currp);
    pSVar21 = (SIMDLoad *)Expression::cast<wasm::BrOn>(this);
LAB_00b5912c:
    ppEVar4 = &pSVar21->ptr;
    goto LAB_00b59410;
  case StructNewId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitStructNew,currp);
    pSVar20 = Expression::cast<wasm::StructNew>(this);
    uVar29 = (ulong)(uint)(pSVar20->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar20->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
                ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case StructGetId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitStructGet,currp);
    pSVar10 = Expression::cast<wasm::StructGet>(this);
    goto LAB_00b59229;
  case StructSetId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitStructSet,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StructSet>(this);
    goto LAB_00b59192;
  case StructRMWId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitStructRMW,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StructRMW>(this);
    goto LAB_00b59192;
  case StructCmpxchgId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitStructCmpxchg,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StructCmpxchg>(this);
LAB_00b58ff1:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,&pAVar5->timeout);
LAB_00b5900a:
    ppEVar4 = &pAVar5->expected;
    goto LAB_00b591a0;
  case ArrayNewId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitArrayNew,currp);
    pAVar18 = Expression::cast<wasm::ArrayNew>(this);
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,&pAVar18->size);
    ppEVar4 = &pAVar18->init;
LAB_00b58ecb:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::maybePushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,ppEVar4);
    return;
  case ArrayNewDataId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitArrayNewData,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayNewData>(this);
    goto LAB_00b59270;
  case ArrayNewElemId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitArrayNewElem,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayNewElem>(this);
    goto LAB_00b59270;
  case ArrayNewFixedId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitArrayNewFixed,currp);
    pAVar28 = Expression::cast<wasm::ArrayNewFixed>(this);
    uVar29 = (ulong)(uint)(pAVar28->values).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pAVar28->values).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
                ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case ArrayGetId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitArrayGet,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayGet>(this);
    goto LAB_00b593f8;
  case ArraySetId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitArraySet,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArraySet>(this);
    goto LAB_00b593e9;
  case ArrayLenId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitArrayLen,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::ArrayLen>(this);
    goto LAB_00b59062;
  case ArrayCopyId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitArrayCopy,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayCopy>(this);
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,
               (Expression **)&(pMVar25->destMemory).super_IString.str._M_str);
    goto LAB_00b593da;
  case ArrayFillId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitArrayFill,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayFill>(this);
LAB_00b593da:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,
               (Expression **)&pMVar25->destMemory);
    goto LAB_00b593e9;
  case ArrayInitDataId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitArrayInitData,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayInitData>(this);
    goto LAB_00b58b37;
  case ArrayInitElemId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitArrayInitElem,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayInitElem>(this);
LAB_00b58b37:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,
               (Expression **)&pAVar12->memory);
LAB_00b59261:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,&pAVar12->replacement);
LAB_00b59270:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,&pAVar12->expected);
    ppEVar4 = &pAVar12->ptr;
    goto LAB_00b59410;
  case RefAsId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitRefAs,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::RefAs>(this);
    goto LAB_00b59229;
  case StringNewId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitStringNew,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StringNew>(this);
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::maybePushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,&pAVar5->timeout);
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::maybePushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,&pAVar5->expected);
    goto LAB_00b591ab;
  case StringConstId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitStringConst,currp);
    Expression::cast<wasm::StringConst>(this);
    return;
  case StringMeasureId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitStringMeasure,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::StringMeasure>(this);
LAB_00b59229:
    ppEVar4 = &pSVar10->ref;
    goto LAB_00b59410;
  case StringEncodeId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitStringEncode,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StringEncode>(this);
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::maybePushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,&pAVar5->timeout);
    goto LAB_00b5900a;
  case StringConcatId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitStringConcat,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringConcat>(this);
    goto LAB_00b593f8;
  case StringEqId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitStringEq,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StringEq>(this);
LAB_00b59192:
    ppEVar4 = &pAVar5->expected;
LAB_00b591a0:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,ppEVar4);
LAB_00b591ab:
    ppEVar4 = &pAVar5->ptr;
    goto LAB_00b59410;
  case StringWTF16GetId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitStringWTF16Get,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringWTF16Get>(this);
    goto LAB_00b593f8;
  case StringSliceWTFId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitStringSliceWTF,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringSliceWTF>(this);
LAB_00b593e9:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,&pMVar25->size);
LAB_00b593f8:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,&pMVar25->source);
    ppEVar4 = &pMVar25->dest;
    goto LAB_00b59410;
  case ContNewId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitContNew,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::ContNew>(this);
LAB_00b59062:
    ppEVar4 = &pTVar7->body;
LAB_00b59410:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,ppEVar4);
    return;
  case ContBindId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitContBind,currp);
    pCVar6 = Expression::cast<wasm::ContBind>(this);
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,&pCVar6->cont);
    uVar29 = (ulong)(uint)(pCVar6->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar6->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
                ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case SuspendId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitSuspend,currp);
    pSVar22 = Expression::cast<wasm::Suspend>(this);
    uVar29 = (ulong)(uint)(pSVar22->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar22->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
                ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case ResumeId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitResume,currp);
    pRVar2 = Expression::cast<wasm::Resume>(this);
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,&pRVar2->cont);
    uVar29 = (ulong)(uint)(pRVar2->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pRVar2->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
                ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case ResumeThrowId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitResumeThrow,currp);
    pRVar26 = Expression::cast<wasm::ResumeThrow>(this);
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,&pRVar26->cont);
    uVar29 = (ulong)(uint)(pRVar26->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pRVar26->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
                ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case StackSwitchId:
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,
               Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::doVisitStackSwitch,currp);
    pSVar3 = Expression::cast<wasm::StackSwitch>(this);
    Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
              ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,&pSVar3->cont);
    uVar29 = (ulong)(uint)(pSVar3->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar29) {
      uVar29 = uVar29 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar3->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar29);
      Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::pushTask
                ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)self,scan,ppEVar4);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }